

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::storeLeakInformation
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *new_memory,size_t size,
          TestMemoryAllocator *allocator,char *file,size_t line)

{
  char *file_local;
  TestMemoryAllocator *allocator_local;
  size_t size_local;
  char *new_memory_local;
  MemoryLeakDetectorNode *node_local;
  MemoryLeakDetector *this_local;
  
  this->allocationSequenceNumber_ = this->allocationSequenceNumber_ + 1;
  MemoryLeakDetectorNode::init(node,(EVP_PKEY_CTX *)new_memory);
  addMemoryCorruptionInformation(this,(char *)(*(long *)(node + 0x10) + *(long *)node));
  MemoryLeakDetectorTable::addNewNode(&this->memoryTable_,node);
  return;
}

Assistant:

void MemoryLeakDetector::storeLeakInformation(MemoryLeakDetectorNode * node, char *new_memory, size_t size, TestMemoryAllocator *allocator, const char *file, size_t line)
{
    node->init(new_memory, allocationSequenceNumber_++, size, allocator, current_period_, current_allocation_stage_, file, line);
    addMemoryCorruptionInformation(node->memory_ + node->size_);
    memoryTable_.addNewNode(node);
}